

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O3

cmd_params * parse_cmd_params(cmd_params *__return_storage_ptr__,int argc,char **argv)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __last_01;
  _Bit_iterator __last_02;
  _Bit_iterator __last_03;
  _Bvector_impl *p_Var11;
  output_formats oVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  llama_split_mode lVar18;
  ggml_sched_priority gVar19;
  long lVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  size_type __n;
  ulong uVar24;
  undefined7 extraout_var;
  cmd_params *extraout_RAX;
  cmd_params *pcVar25;
  char separator;
  char delim;
  char delim_00;
  char delim_01;
  char separator_00;
  char delim_02;
  char separator_01;
  char separator_02;
  char delim_03;
  char separator_03;
  char delim_04;
  char delim_05;
  char delim_06;
  char separator_04;
  char delim_07;
  char delim_08;
  char delim_09;
  char delim_10;
  char delim_11;
  char separator_05;
  char *pcVar26;
  byte *pbVar27;
  output_formats *format;
  string *psVar28;
  ggml_type gVar29;
  size_t i;
  ggml_numa_strategy gVar30;
  _Alloc_hider _Var31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  long lVar32;
  float fVar33;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __first_01;
  _Bit_iterator __first_02;
  _Bit_iterator __first_03;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator __position_01;
  const_iterator __position_02;
  const_iterator __position_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts;
  string arg;
  sregex_token_iterator it;
  regex regex;
  vector<float,_std::allocator<float>_> tensor_split;
  string arg_prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_arg;
  undefined1 local_3b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined1 local_380 [24];
  undefined1 local_368 [16];
  string local_358 [3];
  pointer local_2e0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2d8;
  allocator_type local_2b5;
  ggml_type local_2b4;
  vector<float,_std::allocator<float>_> local_2b0;
  pointer local_298;
  string *local_290;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  output_formats *local_260;
  output_formats *local_258;
  vector<bool,std::allocator<bool>> *local_250;
  vector<bool,std::allocator<bool>> *local_248;
  vector<bool,std::allocator<bool>> *local_240;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_220;
  vector<llama_split_mode,std::allocator<llama_split_mode>> *local_218;
  vector<int,std::allocator<int>> *local_210;
  vector<int,std::allocator<int>> *local_208;
  vector<bool,std::allocator<bool>> *local_200;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  vector<int,std::allocator<int>> *local_1f0;
  vector<ggml_type,std::allocator<ggml_type>> *local_1e8;
  vector<ggml_type,std::allocator<ggml_type>> *local_1e0;
  vector<int,std::allocator<int>> *local_1d8;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_1d0;
  vector<int,std::allocator<int>> *local_1c8;
  vector<int,std::allocator<int>> *local_1c0;
  vector<int,std::allocator<int>> *local_1b8;
  string local_1b0;
  uint uStack_190;
  undefined4 uStack_18c;
  pointer local_188;
  uint uStack_180;
  undefined4 uStack_17c;
  pointer local_178;
  uint uStack_170;
  undefined4 uStack_16c;
  pointer local_168;
  uint uStack_160;
  undefined4 uStack_15c;
  pointer local_158;
  uint uStack_150;
  undefined4 uStack_14c;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_148;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_b8;
  
  (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  memset(__return_storage_ptr__,0,0xfc);
  memset(&(__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage,0,0x8c);
  (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->tensor_split).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tensor_split).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tensor_split).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->tensor_split).
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_390._M_allocated_capacity = (size_type)local_380;
  local_390._8_8_ = (char *)0x0;
  local_380[0] = 0;
  local_298 = (pointer)local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"--","");
  __return_storage_ptr__->verbose = cmd_params_defaults.verbose;
  oVar12 = cmd_params_defaults.output_format_stderr;
  __return_storage_ptr__->output_format = cmd_params_defaults.output_format;
  uVar22 = cmd_params_defaults._592_8_;
  __return_storage_ptr__->output_format_stderr = oVar12;
  iVar17 = cmd_params_defaults.reps;
  __return_storage_ptr__->numa = cmd_params_defaults.numa;
  uVar21 = cmd_params_defaults._592_8_;
  __return_storage_ptr__->reps = iVar17;
  cmd_params_defaults.prio = (ggml_sched_priority)uVar22;
  cmd_params_defaults.delay = SUB84(uVar22,4);
  iVar17 = cmd_params_defaults.delay;
  __return_storage_ptr__->prio = cmd_params_defaults.prio;
  cmd_params_defaults._592_8_ = uVar21;
  __return_storage_ptr__->delay = iVar17;
  __return_storage_ptr__->progress = cmd_params_defaults.progress;
  if (argc < 2) goto LAB_0011ae7c;
  local_258 = &__return_storage_ptr__->output_format;
  local_260 = &__return_storage_ptr__->output_format_stderr;
  local_238 = (pointer)&__return_storage_ptr__->tensor_split;
  local_250 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->embeddings;
  local_248 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->use_mmap;
  local_240 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->flash_attn;
  local_230 = (pointer)&__return_storage_ptr__->no_kv_offload;
  local_228 = (pointer)&__return_storage_ptr__->main_gpu;
  local_218 = (vector<llama_split_mode,std::allocator<llama_split_mode>> *)
              &__return_storage_ptr__->split_mode;
  local_220 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->rpc_servers;
  local_208 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_gpu_layers;
  local_210 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->poll;
  local_200 = (vector<bool,std::allocator<bool>> *)&__return_storage_ptr__->cpu_strict;
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->cpu_mask;
  local_1f0 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_threads;
  local_1e8 = (vector<ggml_type,std::allocator<ggml_type>> *)&__return_storage_ptr__->type_v;
  local_1e0 = (vector<ggml_type,std::allocator<ggml_type>> *)&__return_storage_ptr__->type_k;
  local_1d8 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_ubatch;
  local_1c8 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_batch;
  local_1d0 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
              &__return_storage_ptr__->n_pg;
  local_1c0 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_gen;
  local_1b8 = (vector<int,std::allocator<int>> *)&__return_storage_ptr__->n_prompt;
  iVar17 = 1;
  local_380._16_8_ = (pointer)0x0;
LAB_00119610:
  uVar22 = local_390._8_8_;
  pcVar26 = argv[iVar17];
  strlen(pcVar26);
  std::__cxx11::string::_M_replace((ulong)&local_390,0,(char *)uVar22,(ulong)pcVar26);
  iVar15 = std::__cxx11::string::compare((ulong)&local_390,0,local_290);
  if ((iVar15 == 0) && ((char *)local_390._8_8_ != (char *)0x0)) {
    pcVar26 = (char *)0x0;
    do {
      if (pcVar26[local_390._M_allocated_capacity] == '_') {
        pcVar26[local_390._M_allocated_capacity] = '-';
      }
      pcVar26 = pcVar26 + 1;
    } while ((char *)local_390._8_8_ != pcVar26);
  }
  pcVar26 = "-h";
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if (iVar15 == 0) goto LAB_0011b1e9;
  pcVar26 = "--help";
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if (iVar15 == 0) goto LAB_0011b1e9;
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (argc <= iVar17 + 1) goto LAB_0011b1ba;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
    string_split<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3b0,(string *)local_368,separator);
    if ((string *)local_368._0_8_ != local_358) {
      operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->model).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
LAB_00119c02:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3b0);
    iVar15 = iVar17 + 1;
LAB_00119d10:
    iVar17 = iVar15 + 1;
    if (argc <= iVar17) goto LAB_0011ae71;
    goto LAB_00119610;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (argc <= iVar17 + 1) goto LAB_0011b1ba;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
    string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim);
    if ((string *)local_368._0_8_ != local_358) {
      operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
    }
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_1b8,
               (__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
LAB_00119cf9:
    uVar22 = local_3b0._16_8_;
    psVar28 = (string *)local_3b0._0_8_;
    iVar15 = iVar17 + 1;
    if ((string *)local_3b0._0_8_ != (string *)0x0) {
LAB_00119d08:
      operator_delete(psVar28,uVar22 - (long)psVar28);
      iVar15 = iVar17 + 1;
    }
    goto LAB_00119d10;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim_00)
      ;
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1c0,
                 (__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
      goto LAB_00119cf9;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if (iVar15 == 0) {
    iVar15 = iVar17 + 1;
    if (iVar15 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar15],(allocator<char> *)&local_2d8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b0,(string *)local_368,separator_00);
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      if (local_3b0._8_8_ - local_3b0._0_8_ == 0x40) {
        psVar28 = *(string **)local_3b0._0_8_;
        local_2e0 = (pointer)__errno_location();
        local_2b4 = *local_2e0;
        *local_2e0 = GGML_TYPE_F32;
        lVar32 = strtol((char *)psVar28,(char **)local_368,10);
        if ((string *)local_368._0_8_ == psVar28) goto LAB_0011b256;
        if (((int)(flag_type)lVar32 == lVar32) && (gVar29 = *local_2e0, gVar29 != GGML_TYPE_TQ1_0))
        {
          if (gVar29 == GGML_TYPE_F32) {
            *local_2e0 = local_2b4;
            gVar29 = local_2b4;
          }
          psVar28 = (string *)(((string *)(local_3b0._0_8_ + 0x20))->_M_dataplus)._M_p;
          *local_2e0 = GGML_TYPE_F32;
          lVar20 = strtol((char *)psVar28,(char **)local_368,10);
          if ((string *)local_368._0_8_ != psVar28) {
            if ((0xfffffffeffffffff < lVar20 - 0x80000000U) && (*local_2e0 != GGML_TYPE_TQ1_0)) {
              if (*local_2e0 == GGML_TYPE_F32) {
                *local_2e0 = gVar29;
              }
              local_2d8._4_4_ = SUB84(lVar20,0);
              local_2d8._M_flags = (flag_type)lVar32;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<std::pair<int,int>>(local_1d0,(pair<int,_int> *)&local_2d8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3b0);
              goto LAB_00119d10;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
        }
        std::__throw_out_of_range("stoi");
LAB_0011b256:
        std::__throw_invalid_argument("stoi");
LAB_0011b262:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llama-bench/llama-bench.cpp"
                   ,0x224,"GGML_ASSERT(%s) failed","split_arg.size() <= llama_max_devices()");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b0);
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim_01)
      ;
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1c8,
                 (__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
      goto LAB_00119cf9;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim_02)
      ;
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1d8,
                 (__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
      goto LAB_00119cf9;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b0,(string *)local_368,separator_01);
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      uVar22 = local_3b0._8_8_;
      local_368._0_8_ = (string *)0x0;
      local_368._8_8_ = (llama_split_mode *)0x0;
      local_358[0]._M_dataplus._M_p = (pointer)0x0;
      for (psVar28 = (string *)local_3b0._0_8_; psVar28 != (string *)uVar22; psVar28 = psVar28 + 1)
      {
        local_2d8._M_flags = ggml_type_from_name(psVar28);
        uVar21 = CONCAT44(extraout_var_00,local_2d8._M_flags);
        if (local_2d8._M_flags == 0x27) goto LAB_0011ae41;
        if ((pointer)local_368._8_8_ == local_358[0]._M_dataplus._M_p) {
          std::vector<ggml_type,std::allocator<ggml_type>>::_M_realloc_insert<ggml_type_const&>
                    ((vector<ggml_type,std::allocator<ggml_type>> *)local_368,
                     (iterator)local_368._8_8_,&local_2d8._M_flags);
        }
        else {
          *(flag_type *)local_368._8_8_ = local_2d8._M_flags;
          local_368._8_8_ = local_368._8_8_ + 4;
        }
      }
      if ((local_380._16_8_ & 1) == 0) {
        std::vector<ggml_type,std::allocator<ggml_type>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>>
                  (local_1e0,
                   (__return_storage_ptr__->type_k).
                   super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_368._0_8_,local_368._8_8_);
LAB_0011a190:
        if ((string *)local_368._0_8_ != (string *)0x0) {
          operator_delete((void *)local_368._0_8_,
                          (long)local_358[0]._M_dataplus._M_p - local_368._0_8_);
        }
        goto LAB_00119c02;
      }
      goto LAB_0011ae48;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b0,(string *)local_368,separator_02);
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      uVar22 = local_3b0._8_8_;
      local_368._0_8_ = (string *)0x0;
      local_368._8_8_ = (llama_split_mode *)0x0;
      local_358[0]._M_dataplus._M_p = (pointer)0x0;
      for (psVar28 = (string *)local_3b0._0_8_; psVar28 != (string *)uVar22; psVar28 = psVar28 + 1)
      {
        local_2d8._M_flags = ggml_type_from_name(psVar28);
        uVar21 = CONCAT44(extraout_var_01,local_2d8._M_flags);
        if (local_2d8._M_flags == 0x27) goto LAB_0011ae41;
        if ((pointer)local_368._8_8_ == local_358[0]._M_dataplus._M_p) {
          std::vector<ggml_type,std::allocator<ggml_type>>::_M_realloc_insert<ggml_type_const&>
                    ((vector<ggml_type,std::allocator<ggml_type>> *)local_368,
                     (iterator)local_368._8_8_,&local_2d8._M_flags);
        }
        else {
          *(flag_type *)local_368._8_8_ = local_2d8._M_flags;
          local_368._8_8_ = local_368._8_8_ + 4;
        }
      }
      if ((local_380._16_8_ & 1) == 0) {
        std::vector<ggml_type,std::allocator<ggml_type>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ggml_type*,std::vector<ggml_type,std::allocator<ggml_type>>>>
                  (local_1e8,
                   (__return_storage_ptr__->type_v).
                   super__Vector_base<ggml_type,_std::allocator<ggml_type>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_368._0_8_,local_368._8_8_);
        goto LAB_0011a190;
      }
      goto LAB_0011ae48;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim_03)
      ;
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_1f0,
                 (__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
      goto LAB_00119cf9;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b0,(string *)local_368,separator_03);
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_1f8,
                 (__return_storage_ptr__->cpu_mask).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
      goto LAB_00119c02;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if (iVar15 == 0) {
    iVar15 = iVar17 + 1;
    if (iVar15 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3b0,argv[iVar15],(allocator<char> *)&local_2d8);
      string_split<bool>((vector<bool,_std::allocator<bool>_> *)local_368,(string *)local_3b0,
                         delim_04);
      if ((string *)local_3b0._0_8_ != (string *)(local_3b0 + 0x10)) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      p_Var11 = &(__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>.
                 _M_impl;
      uVar1 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
      uVar2 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
      __position.super__Bit_iterator_base._M_offset = uVar2;
      __position.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
      local_158 = (pointer)local_358[0]._M_dataplus._M_p;
      uStack_150 = (undefined4)local_358[0]._M_string_length;
      __last.super__Bit_iterator_base._12_4_ = uStack_14c;
      __last.super__Bit_iterator_base._M_offset = (undefined4)local_358[0]._M_string_length;
      __last.super__Bit_iterator_base._M_p = (_Bit_type *)local_358[0]._M_dataplus._M_p;
      __first.super__Bit_iterator_base._8_8_ = 0;
      __first.super__Bit_iterator_base._M_p = (_Bit_type *)local_368._0_8_;
      __position.super__Bit_iterator_base._12_4_ = 0;
      std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                (local_200,__position,__first,__last);
      uVar22 = local_358[0].field_2._M_allocated_capacity;
      psVar28 = (string *)local_368._0_8_;
      if ((string *)local_368._0_8_ == (string *)0x0) goto LAB_00119d10;
      goto LAB_00119d08;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if (iVar15 == 0) {
    if (iVar17 + 1 < argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim_06)
      ;
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_210,
                 (__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
      goto LAB_00119cf9;
    }
    goto LAB_0011b1ba;
  }
  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
  if ((iVar15 == 0) || (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)
     ) {
    if (argc <= iVar17 + 1) goto LAB_0011b1ba;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
    string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,delim_05);
    if ((string *)local_368._0_8_ != local_358) {
      operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
    }
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_208,
               (__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_3b0._0_8_,local_3b0._8_8_);
    goto LAB_00119cf9;
  }
  cVar13 = llama_supports_rpc();
  if ((cVar13 == '\0') ||
     ((iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 != 0 &&
      (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 != 0)))) {
    iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
    if ((iVar15 == 0) ||
       (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
      if (argc <= iVar17 + 1) goto LAB_0011b1ba;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3b0,(string *)local_368,separator_04);
      if ((string *)local_368._0_8_ != local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
      }
      uVar22 = local_3b0._8_8_;
      local_368._0_8_ = (string *)0x0;
      local_368._8_8_ = (llama_split_mode *)0x0;
      local_358[0]._M_dataplus._M_p = (pointer)0x0;
      for (psVar28 = (string *)local_3b0._0_8_; psVar28 != (string *)uVar22; psVar28 = psVar28 + 1)
      {
        iVar15 = std::__cxx11::string::compare((char *)psVar28);
        if (iVar15 == 0) {
          local_2d8._M_flags = 0;
          lVar18 = LLAMA_SPLIT_MODE_NONE;
        }
        else {
          iVar15 = std::__cxx11::string::compare((char *)psVar28);
          if (iVar15 == 0) {
            local_2d8._M_flags = 1;
            lVar18 = LLAMA_SPLIT_MODE_LAYER;
          }
          else {
            uVar21 = std::__cxx11::string::compare((char *)psVar28);
            if ((int)uVar21 != 0) {
              local_380._16_8_ = CONCAT71((int7)((ulong)uVar21 >> 8),1);
              goto LAB_0011b204;
            }
            local_2d8._M_flags = 2;
            lVar18 = LLAMA_SPLIT_MODE_ROW;
          }
        }
        if ((pointer)local_368._8_8_ == local_358[0]._M_dataplus._M_p) {
          std::vector<llama_split_mode,std::allocator<llama_split_mode>>::
          _M_realloc_insert<llama_split_mode_const&>
                    ((vector<llama_split_mode,std::allocator<llama_split_mode>> *)local_368,
                     (iterator)local_368._8_8_,&local_2d8._M_flags);
        }
        else {
          *(llama_split_mode *)local_368._8_8_ = lVar18;
          local_368._8_8_ = local_368._8_8_ + 4;
        }
      }
      if ((local_380._16_8_ & 1) == 0) {
        std::vector<llama_split_mode,std::allocator<llama_split_mode>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<llama_split_mode*,std::vector<llama_split_mode,std::allocator<llama_split_mode>>>>
                  (local_218,
                   (__return_storage_ptr__->split_mode).
                   super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_368._0_8_,local_368._8_8_);
        psVar28 = (string *)local_3b0;
        if ((string *)local_368._0_8_ != (string *)0x0) {
          operator_delete((void *)local_368._0_8_,
                          (long)local_358[0]._M_dataplus._M_p - local_368._0_8_);
        }
LAB_0011a5c8:
        iVar15 = iVar17 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)psVar28);
        goto LAB_00119d10;
      }
LAB_0011b204:
      if ((string *)local_368._0_8_ != (string *)0x0) {
        operator_delete((void *)local_368._0_8_,
                        (long)local_358[0]._M_dataplus._M_p - local_368._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b0);
      goto LAB_0011ae71;
    }
    iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
    if ((iVar15 == 0) ||
       (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
      if (iVar17 + 1 < argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
        string_split<int>((vector<int,_std::allocator<int>_> *)local_3b0,(string *)local_368,
                          delim_07);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  ((vector<int,_std::allocator<int>_> *)local_228);
        if ((string *)local_3b0._0_8_ != (string *)0x0) {
          operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ - local_3b0._0_8_);
        }
        goto LAB_0011a668;
      }
      goto LAB_0011b1ba;
    }
    iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
    if ((iVar15 == 0) ||
       (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
      if (argc <= iVar17 + 1) goto LAB_0011b1ba;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3b0,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
      string_split<bool>((vector<bool,_std::allocator<bool>_> *)local_368,(string *)local_3b0,
                         delim_08);
      if ((string *)local_3b0._0_8_ != (string *)(local_3b0 + 0x10)) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      p_Var11 = &(__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>.
                 _M_impl;
      uVar3 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
      uVar4 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
      __position_00.super__Bit_iterator_base._M_offset = uVar4;
      __position_00.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
      local_168 = (pointer)local_358[0]._M_dataplus._M_p;
      uStack_160 = (undefined4)local_358[0]._M_string_length;
      __last_00.super__Bit_iterator_base._12_4_ = uStack_15c;
      __last_00.super__Bit_iterator_base._M_offset = (undefined4)local_358[0]._M_string_length;
      __last_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_358[0]._M_dataplus._M_p;
      __first_00.super__Bit_iterator_base._8_8_ = 0;
      __first_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_368._0_8_;
      __position_00.super__Bit_iterator_base._12_4_ = 0;
      std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                ((vector<bool,std::allocator<bool>> *)local_230,__position_00,__first_00,__last_00);
    }
    else {
      iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
      if (iVar15 == 0) {
        iVar15 = iVar17 + 1;
        if (argc <= iVar15) goto LAB_0011b1ba;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_368,argv[iVar15],(allocator<char> *)local_3b0);
        iVar17 = std::__cxx11::string::compare(local_368);
        gVar30 = GGML_NUMA_STRATEGY_DISTRIBUTE;
        if ((iVar17 == 0) || (iVar17 = std::__cxx11::string::compare(local_368), iVar17 == 0)) {
LAB_0011a9eb:
          __return_storage_ptr__->numa = gVar30;
          bVar14 = true;
        }
        else {
          iVar17 = std::__cxx11::string::compare(local_368);
          if (iVar17 == 0) {
            gVar30 = GGML_NUMA_STRATEGY_ISOLATE;
            goto LAB_0011a9eb;
          }
          uVar22 = std::__cxx11::string::compare(local_368);
          if ((int)uVar22 == 0) {
            gVar30 = GGML_NUMA_STRATEGY_NUMACTL;
            goto LAB_0011a9eb;
          }
          local_380._16_8_ = CONCAT71((int7)((ulong)uVar22 >> 8),1);
          bVar14 = false;
        }
        if ((string *)local_368._0_8_ != local_358) {
          operator_delete((void *)local_368._0_8_,(ulong)((long)local_358[0]._M_dataplus._M_p + 1));
        }
        if (bVar14) goto LAB_00119d10;
        goto LAB_0011ae71;
      }
      iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
      if ((iVar15 == 0) ||
         (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
        if (argc <= iVar17 + 1) goto LAB_0011b1ba;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3b0,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
        string_split<bool>((vector<bool,_std::allocator<bool>_> *)local_368,(string *)local_3b0,
                           delim_09);
        if ((string *)local_3b0._0_8_ != (string *)(local_3b0 + 0x10)) {
          operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
        }
        p_Var11 = &(__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl;
        uVar5 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
        uVar6 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
        __position_01.super__Bit_iterator_base._M_offset = uVar6;
        __position_01.super__Bit_iterator_base._M_p = (_Bit_type *)uVar5;
        local_178 = (pointer)local_358[0]._M_dataplus._M_p;
        uStack_170 = (undefined4)local_358[0]._M_string_length;
        __last_01.super__Bit_iterator_base._12_4_ = uStack_16c;
        __last_01.super__Bit_iterator_base._M_offset = (undefined4)local_358[0]._M_string_length;
        __last_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_358[0]._M_dataplus._M_p;
        __first_01.super__Bit_iterator_base._8_8_ = 0;
        __first_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_368._0_8_;
        __position_01.super__Bit_iterator_base._12_4_ = 0;
        std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                  (local_240,__position_01,__first_01,__last_01);
      }
      else {
        iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
        if ((iVar15 == 0) ||
           (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
          if (argc <= iVar17 + 1) goto LAB_0011b1ba;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3b0,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
          string_split<bool>((vector<bool,_std::allocator<bool>_> *)local_368,(string *)local_3b0,
                             delim_10);
          if ((string *)local_3b0._0_8_ != (string *)(local_3b0 + 0x10)) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
          p_Var11 = &(__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>.
                     _M_impl;
          uVar7 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
          uVar8 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
          __position_02.super__Bit_iterator_base._M_offset = uVar8;
          __position_02.super__Bit_iterator_base._M_p = (_Bit_type *)uVar7;
          local_188 = (pointer)local_358[0]._M_dataplus._M_p;
          uStack_180 = (undefined4)local_358[0]._M_string_length;
          __last_02.super__Bit_iterator_base._12_4_ = uStack_17c;
          __last_02.super__Bit_iterator_base._M_offset = (undefined4)local_358[0]._M_string_length;
          __last_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_358[0]._M_dataplus._M_p;
          __first_02.super__Bit_iterator_base._8_8_ = 0;
          __first_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_368._0_8_;
          __position_02.super__Bit_iterator_base._12_4_ = 0;
          std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                    (local_248,__position_02,__first_02,__last_02);
        }
        else {
          iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
          if ((iVar15 != 0) &&
             (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 != 0)) {
            iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
            if ((iVar15 == 0) ||
               (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
              if (iVar17 + 1 < argc) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
                string_split<std::__cxx11::string>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_1b0,(string *)local_368,separator_05);
                if ((string *)local_368._0_8_ != local_358) {
                  operator_delete((void *)local_368._0_8_,
                                  (ulong)((long)local_358[0]._M_dataplus._M_p + 1));
                }
                local_2e0 = (pointer)local_1b0._M_string_length;
                _Var31._M_p = local_1b0._M_dataplus._M_p;
                if (local_1b0._M_dataplus._M_p != (pointer)local_1b0._M_string_length) {
                  do {
                    local_3b0._0_8_ = local_3b0 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_3b0,*(undefined8 *)_Var31._M_p,
                               *(undefined8 *)((long)_Var31._M_p + 8) + *(undefined8 *)_Var31._M_p);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                              (&local_2d8,"[;/]+",0x10);
                    std::__cxx11::
                    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    ::regex_token_iterator
                              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                *)local_368,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_3b0._0_8_,
                               (char *)(local_3b0._0_8_ + (long)(_Alloc_hider *)local_3b0._8_8_),
                               &local_2d8,-1,0);
                    std::__cxx11::
                    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    ::regex_token_iterator
                              (&local_b8,
                               (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                *)local_368);
                    local_148._M_suffix.
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .second._M_current._0_1_ = 0;
                    local_148._M_suffix._9_8_ = 0;
                    local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_148._M_suffix.
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .first._M_current._0_1_ = 0;
                    local_148._M_suffix.
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .first._M_current._1_7_ = 0;
                    local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_148._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_148._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_148._M_position._M_match._M_begin._M_current = (char *)0x0;
                    local_148._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_148._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_148._M_position._M_pregex = (regex_type *)0x0;
                    local_148._M_position._M_flags = 0;
                    local_148._M_position._28_4_ = 0;
                    local_148._M_position._M_begin._M_current = (char *)0x0;
                    local_148._M_position._M_end._M_current = (char *)0x0;
                    local_148._M_n = 0;
                    local_148._M_result = (value_type *)0x0;
                    local_148._M_has_m1 = false;
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    vector<std::__cxx11::regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>,void>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               (local_288 + 0x10),&local_b8,&local_148,(allocator_type *)&local_2b0)
                    ;
                    std::__cxx11::
                    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    ::~regex_token_iterator(&local_148);
                    std::__cxx11::
                    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    ::~regex_token_iterator(&local_b8);
                    uVar21 = local_278._8_8_;
                    uVar22 = local_278._M_allocated_capacity;
                    uVar23 = llama_max_devices();
                    if (uVar23 < (ulong)((long)(uVar21 - uVar22) >> 5)) goto LAB_0011b262;
                    __n = llama_max_devices();
                    std::vector<float,_std::allocator<float>_>::vector(&local_2b0,__n,&local_2b5);
                    lVar32 = 0;
                    for (uVar23 = 0; uVar24 = llama_max_devices(), uVar23 < uVar24;
                        uVar23 = uVar23 + 1) {
                      fVar33 = 0.0;
                      if (uVar23 < (ulong)((long)(local_278._8_8_ - local_278._0_8_) >> 5)) {
                        fVar33 = std::__cxx11::stof((string *)
                                                    (local_278._M_allocated_capacity + lVar32),
                                                    (size_t *)0x0);
                      }
                      local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar23] = fVar33;
                      lVar32 = lVar32 + 0x20;
                    }
                    std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::push_back((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 *)local_238,&local_2b0);
                    if (local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_2b0.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2b0.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2b0.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_288 + 0x10));
                    std::__cxx11::
                    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    ::~regex_token_iterator
                              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                *)local_368);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                              (&local_2d8);
                    if ((string *)local_3b0._0_8_ != (string *)(local_3b0 + 0x10)) {
                      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
                    }
                    _Var31._M_p = _Var31._M_p + 0x20;
                  } while ((pointer)_Var31._M_p != local_2e0);
                }
                psVar28 = &local_1b0;
                goto LAB_0011a5c8;
              }
              goto LAB_0011b1ba;
            }
            iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
            if ((iVar15 == 0) ||
               (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
              if (argc <= iVar17 + 1) goto LAB_0011b1ba;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
              iVar15 = std::__cxx11::stoi((string *)local_368,(size_t *)0x0,10);
              __return_storage_ptr__->reps = iVar15;
            }
            else {
              iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
              if (iVar15 != 0) {
                iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
                if (iVar15 == 0) {
                  if (iVar17 + 1 < argc) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
                    iVar15 = std::__cxx11::stoi((string *)local_368,(size_t *)0x0,10);
                    __return_storage_ptr__->delay = iVar15;
                    goto LAB_0011a668;
                  }
                  goto LAB_0011b1ba;
                }
                iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
                if ((iVar15 == 0) ||
                   (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 == 0)) {
                  if (argc <= iVar17 + 1) goto LAB_0011b1ba;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
                  format = local_258;
                }
                else {
                  iVar15 = std::__cxx11::string::compare(local_390._M_local_buf);
                  if ((iVar15 != 0) &&
                     (iVar15 = std::__cxx11::string::compare(local_390._M_local_buf), iVar15 != 0))
                  {
                    iVar16 = std::__cxx11::string::compare(local_390._M_local_buf);
                    iVar15 = iVar17;
                    if ((iVar16 != 0) &&
                       (iVar17 = std::__cxx11::string::compare(local_390._M_local_buf), iVar17 != 0)
                       ) {
                      iVar17 = std::__cxx11::string::compare(local_390._M_local_buf);
                      if (iVar17 == 0) {
                        __return_storage_ptr__->progress = true;
                        goto LAB_00119d10;
                      }
                      goto LAB_0011b1ba;
                    }
                    __return_storage_ptr__->verbose = true;
                    goto LAB_00119d10;
                  }
                  if (argc <= iVar17 + 1) goto LAB_0011b1ba;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
                  format = local_260;
                }
                iVar15 = iVar17 + 1;
                bVar14 = output_format_from_str((string *)local_368,format);
                local_380._16_8_ = CONCAT71(extraout_var,bVar14);
                if ((string *)local_368._0_8_ != local_358) {
                  operator_delete((void *)local_368._0_8_,
                                  (ulong)((long)local_358[0]._M_dataplus._M_p + 1));
                }
                local_380._16_8_ = local_380._16_8_ ^ 1;
                goto LAB_00119d10;
              }
              if (argc <= iVar17 + 1) goto LAB_0011b1ba;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
              gVar19 = std::__cxx11::stoi((string *)local_368,(size_t *)0x0,10);
              __return_storage_ptr__->prio = gVar19;
            }
            goto LAB_0011a668;
          }
          if (argc <= iVar17 + 1) goto LAB_0011b1ba;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_3b0,argv[iVar17 + 1],(allocator<char> *)&local_2d8);
          string_split<bool>((vector<bool,_std::allocator<bool>_> *)local_368,(string *)local_3b0,
                             delim_11);
          if ((string *)local_3b0._0_8_ != (string *)(local_3b0 + 0x10)) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
          p_Var11 = &(__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>
                     ._M_impl;
          uVar9 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
          uVar10 = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
          __position_03.super__Bit_iterator_base._M_offset = uVar10;
          __position_03.super__Bit_iterator_base._M_p = (_Bit_type *)uVar9;
          local_1b0.field_2._8_8_ = local_358[0]._M_dataplus._M_p;
          uStack_190 = (undefined4)local_358[0]._M_string_length;
          __last_03.super__Bit_iterator_base._12_4_ = uStack_18c;
          __last_03.super__Bit_iterator_base._M_offset = (undefined4)local_358[0]._M_string_length;
          __last_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_358[0]._M_dataplus._M_p;
          __first_03.super__Bit_iterator_base._8_8_ = 0;
          __first_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_368._0_8_;
          __position_03.super__Bit_iterator_base._12_4_ = 0;
          std::vector<bool,std::allocator<bool>>::insert<std::_Bit_iterator,void>
                    (local_250,__position_03,__first_03,__last_03);
        }
      }
    }
    iVar15 = iVar17 + 1;
    if ((string *)local_368._0_8_ == (string *)0x0) goto LAB_00119d10;
    pbVar27 = (byte *)(local_358[0].field_2._M_allocated_capacity - local_368._0_8_);
  }
  else {
    if (argc <= iVar17 + 1) goto LAB_0011b1ba;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_368,argv[iVar17 + 1],(allocator<char> *)local_3b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_220,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
LAB_0011a668:
    iVar15 = iVar17 + 1;
    if ((string *)local_368._0_8_ == local_358) goto LAB_00119d10;
    pbVar27 = (byte *)((long)local_358[0]._M_dataplus._M_p + 1);
  }
  iVar15 = iVar17 + 1;
  operator_delete((void *)local_368._0_8_,(ulong)pbVar27);
  goto LAB_00119d10;
LAB_0011ae41:
  local_380._16_8_ = CONCAT71((int7)((ulong)uVar21 >> 8),1);
LAB_0011ae48:
  if ((string *)local_368._0_8_ != (string *)0x0) {
    operator_delete((void *)local_368._0_8_,(long)local_358[0]._M_dataplus._M_p - local_368._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b0);
LAB_0011ae71:
  if ((local_380._16_8_ & 1) != 0) {
LAB_0011b1ba:
    pcVar26 = "error: invalid parameter for argument: %s\n";
    fprintf(_stderr,"error: invalid parameter for argument: %s\n",local_390._M_allocated_capacity);
    print_usage((int)*argv,(char **)pcVar26);
    parse_cmd_params();
LAB_0011b1e9:
    print_usage((int)*argv,(char **)pcVar26);
    exit(0);
  }
LAB_0011ae7c:
  if ((__return_storage_ptr__->model).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->model).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&__return_storage_ptr__->model,&cmd_params_defaults.model);
  }
  if ((__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->n_prompt,&cmd_params_defaults.n_prompt);
  }
  if ((__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_gen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->n_gen,&cmd_params_defaults.n_gen);
  }
  if ((__return_storage_ptr__->n_pg).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_pg).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
              (&__return_storage_ptr__->n_pg,&cmd_params_defaults.n_pg);
  }
  if ((__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_batch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->n_batch,&cmd_params_defaults.n_batch);
  }
  if ((__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_ubatch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->n_ubatch,&cmd_params_defaults.n_ubatch);
  }
  if ((__return_storage_ptr__->type_k).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->type_k).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
              (&__return_storage_ptr__->type_k,&cmd_params_defaults.type_k);
  }
  if ((__return_storage_ptr__->type_v).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->type_v).super__Vector_base<ggml_type,_std::allocator<ggml_type>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<ggml_type,_std::allocator<ggml_type>_>::operator=
              (&__return_storage_ptr__->type_v,&cmd_params_defaults.type_v);
  }
  if ((__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_gpu_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->n_gpu_layers,&cmd_params_defaults.n_gpu_layers);
  }
  if ((__return_storage_ptr__->rpc_servers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->rpc_servers).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&__return_storage_ptr__->rpc_servers,&cmd_params_defaults.rpc_servers);
  }
  if ((__return_storage_ptr__->split_mode).
      super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->split_mode).
      super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>::operator=
              (&__return_storage_ptr__->split_mode,&cmd_params_defaults.split_mode);
  }
  if ((__return_storage_ptr__->main_gpu).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->main_gpu).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->main_gpu,&cmd_params_defaults.main_gpu);
  }
  if (((__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
       (__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((__return_storage_ptr__->no_kv_offload).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&__return_storage_ptr__->no_kv_offload,&cmd_params_defaults.no_kv_offload);
  }
  if (((__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
       (__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((__return_storage_ptr__->flash_attn).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&__return_storage_ptr__->flash_attn,&cmd_params_defaults.flash_attn);
  }
  if ((__return_storage_ptr__->tensor_split).
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->tensor_split).
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::operator=(&__return_storage_ptr__->tensor_split,&cmd_params_defaults.tensor_split);
  }
  if (((__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
       (__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((__return_storage_ptr__->use_mmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&__return_storage_ptr__->use_mmap,&cmd_params_defaults.use_mmap);
  }
  if (((__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
       (__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((__return_storage_ptr__->embeddings).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&__return_storage_ptr__->embeddings,&cmd_params_defaults.embeddings);
  }
  if ((__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->n_threads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->n_threads,&cmd_params_defaults.n_threads);
  }
  if ((__return_storage_ptr__->cpu_mask).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->cpu_mask).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&__return_storage_ptr__->cpu_mask,&cmd_params_defaults.cpu_mask);
  }
  if (((__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
       (__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((__return_storage_ptr__->cpu_strict).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&__return_storage_ptr__->cpu_strict,&cmd_params_defaults.cpu_strict);
  }
  if ((__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->poll).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->poll,&cmd_params_defaults.poll);
  }
  if (local_298 != (pointer)local_288) {
    operator_delete(local_298,(ulong)(local_288._0_8_ + 1));
  }
  pcVar25 = (cmd_params *)local_380;
  if ((cmd_params *)local_390._M_allocated_capacity != pcVar25) {
    operator_delete((void *)local_390._M_allocated_capacity,
                    CONCAT71(local_380._1_7_,local_380[0]) + 1);
    pcVar25 = extraout_RAX;
  }
  return pcVar25;
}

Assistant:

static cmd_params parse_cmd_params(int argc, char ** argv) {
    cmd_params        params;
    std::string       arg;
    bool              invalid_param = false;
    const std::string arg_prefix    = "--";
    const char        split_delim   = ',';

    params.verbose              = cmd_params_defaults.verbose;
    params.output_format        = cmd_params_defaults.output_format;
    params.output_format_stderr = cmd_params_defaults.output_format_stderr;
    params.reps                 = cmd_params_defaults.reps;
    params.numa                 = cmd_params_defaults.numa;
    params.prio                 = cmd_params_defaults.prio;
    params.delay                = cmd_params_defaults.delay;
    params.progress             = cmd_params_defaults.progress;

    for (int i = 1; i < argc; i++) {
        arg = argv[i];
        if (arg.compare(0, arg_prefix.size(), arg_prefix) == 0) {
            std::replace(arg.begin(), arg.end(), '_', '-');
        }

        if (arg == "-h" || arg == "--help") {
            print_usage(argc, argv);
            exit(0);
        } else if (arg == "-m" || arg == "--model") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.model.insert(params.model.end(), p.begin(), p.end());
        } else if (arg == "-p" || arg == "--n-prompt") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_prompt.insert(params.n_prompt.end(), p.begin(), p.end());
        } else if (arg == "-n" || arg == "--n-gen") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gen.insert(params.n_gen.end(), p.begin(), p.end());
        } else if (arg == "-pg") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], ',');
            if (p.size() != 2) {
                invalid_param = true;
                break;
            }
            params.n_pg.push_back({ std::stoi(p[0]), std::stoi(p[1]) });
        } else if (arg == "-b" || arg == "--batch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_batch.insert(params.n_batch.end(), p.begin(), p.end());
        } else if (arg == "-ub" || arg == "--ubatch-size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_ubatch.insert(params.n_ubatch.end(), p.begin(), p.end());
        } else if (arg == "-ctk" || arg == "--cache-type-k") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_k.insert(params.type_k.end(), types.begin(), types.end());
        } else if (arg == "-ctv" || arg == "--cache-type-v") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                   p = string_split<std::string>(argv[i], split_delim);
            std::vector<ggml_type> types;
            for (const auto & t : p) {
                ggml_type gt = ggml_type_from_name(t);
                if (gt == GGML_TYPE_COUNT) {
                    invalid_param = true;
                    break;
                }
                types.push_back(gt);
            }
            if (invalid_param) {
                break;
            }
            params.type_v.insert(params.type_v.end(), types.begin(), types.end());
        } else if (arg == "-t" || arg == "--threads") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_threads.insert(params.n_threads.end(), p.begin(), p.end());
        } else if (arg == "-C" || arg == "--cpu-mask") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<std::string>(argv[i], split_delim);
            params.cpu_mask.insert(params.cpu_mask.end(), p.begin(), p.end());
        } else if (arg == "--cpu-strict") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.cpu_strict.insert(params.cpu_strict.end(), p.begin(), p.end());
        } else if (arg == "--poll") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.poll.insert(params.poll.end(), p.begin(), p.end());
        } else if (arg == "-ngl" || arg == "--n-gpu-layers") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<int>(argv[i], split_delim);
            params.n_gpu_layers.insert(params.n_gpu_layers.end(), p.begin(), p.end());
        } else if (llama_supports_rpc() && (arg == "-rpc" || arg == "--rpc")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.rpc_servers.push_back(argv[i]);
        } else if (arg == "-sm" || arg == "--split-mode") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto                          p = string_split<std::string>(argv[i], split_delim);
            std::vector<llama_split_mode> modes;
            for (const auto & m : p) {
                llama_split_mode mode;
                if (m == "none") {
                    mode = LLAMA_SPLIT_MODE_NONE;
                } else if (m == "layer") {
                    mode = LLAMA_SPLIT_MODE_LAYER;
                } else if (m == "row") {
                    mode = LLAMA_SPLIT_MODE_ROW;
                } else {
                    invalid_param = true;
                    break;
                }
                modes.push_back(mode);
            }
            if (invalid_param) {
                break;
            }
            params.split_mode.insert(params.split_mode.end(), modes.begin(), modes.end());
        } else if (arg == "-mg" || arg == "--main-gpu") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.main_gpu = string_split<int>(argv[i], split_delim);
        } else if (arg == "-nkvo" || arg == "--no-kv-offload") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.no_kv_offload.insert(params.no_kv_offload.end(), p.begin(), p.end());
        } else if (arg == "--numa") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            } else {
                std::string value(argv[i]);
                /**/ if (value == "distribute" || value == "") {
                    params.numa = GGML_NUMA_STRATEGY_DISTRIBUTE;
                } else if (value == "isolate") {
                    params.numa = GGML_NUMA_STRATEGY_ISOLATE;
                } else if (value == "numactl") {
                    params.numa = GGML_NUMA_STRATEGY_NUMACTL;
                } else {
                    invalid_param = true;
                    break;
                }
            }
        } else if (arg == "-fa" || arg == "--flash-attn") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.flash_attn.insert(params.flash_attn.end(), p.begin(), p.end());
        } else if (arg == "-mmp" || arg == "--mmap") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.use_mmap.insert(params.use_mmap.end(), p.begin(), p.end());
        } else if (arg == "-embd" || arg == "--embeddings") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            auto p = string_split<bool>(argv[i], split_delim);
            params.embeddings.insert(params.embeddings.end(), p.begin(), p.end());
        } else if (arg == "-ts" || arg == "--tensor-split") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            for (auto ts : string_split<std::string>(argv[i], split_delim)) {
                // split string by ; and /
                const std::regex           regex{ R"([;/]+)" };
                std::sregex_token_iterator it{ ts.begin(), ts.end(), regex, -1 };
                std::vector<std::string>   split_arg{ it, {} };
                GGML_ASSERT(split_arg.size() <= llama_max_devices());

                std::vector<float> tensor_split(llama_max_devices());
                for (size_t i = 0; i < llama_max_devices(); ++i) {
                    if (i < split_arg.size()) {
                        tensor_split[i] = std::stof(split_arg[i]);
                    } else {
                        tensor_split[i] = 0.0f;
                    }
                }
                params.tensor_split.push_back(tensor_split);
            }
        } else if (arg == "-r" || arg == "--repetitions") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.reps = std::stoi(argv[i]);
        } else if (arg == "--prio") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.prio = (enum ggml_sched_priority) std::stoi(argv[i]);
        } else if (arg == "--delay") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.delay = std::stoi(argv[i]);
        } else if (arg == "-o" || arg == "--output") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format);
        } else if (arg == "-oe" || arg == "--output-err") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            invalid_param = !output_format_from_str(argv[i], params.output_format_stderr);
        } else if (arg == "-v" || arg == "--verbose") {
            params.verbose = true;
        } else if (arg == "--progress") {
            params.progress = true;
        } else {
            invalid_param = true;
            break;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        print_usage(argc, argv);
        exit(1);
    }

    // set defaults
    if (params.model.empty()) {
        params.model = cmd_params_defaults.model;
    }
    if (params.n_prompt.empty()) {
        params.n_prompt = cmd_params_defaults.n_prompt;
    }
    if (params.n_gen.empty()) {
        params.n_gen = cmd_params_defaults.n_gen;
    }
    if (params.n_pg.empty()) {
        params.n_pg = cmd_params_defaults.n_pg;
    }
    if (params.n_batch.empty()) {
        params.n_batch = cmd_params_defaults.n_batch;
    }
    if (params.n_ubatch.empty()) {
        params.n_ubatch = cmd_params_defaults.n_ubatch;
    }
    if (params.type_k.empty()) {
        params.type_k = cmd_params_defaults.type_k;
    }
    if (params.type_v.empty()) {
        params.type_v = cmd_params_defaults.type_v;
    }
    if (params.n_gpu_layers.empty()) {
        params.n_gpu_layers = cmd_params_defaults.n_gpu_layers;
    }
    if (params.rpc_servers.empty()) {
        params.rpc_servers = cmd_params_defaults.rpc_servers;
    }
    if (params.split_mode.empty()) {
        params.split_mode = cmd_params_defaults.split_mode;
    }
    if (params.main_gpu.empty()) {
        params.main_gpu = cmd_params_defaults.main_gpu;
    }
    if (params.no_kv_offload.empty()) {
        params.no_kv_offload = cmd_params_defaults.no_kv_offload;
    }
    if (params.flash_attn.empty()) {
        params.flash_attn = cmd_params_defaults.flash_attn;
    }
    if (params.tensor_split.empty()) {
        params.tensor_split = cmd_params_defaults.tensor_split;
    }
    if (params.use_mmap.empty()) {
        params.use_mmap = cmd_params_defaults.use_mmap;
    }
    if (params.embeddings.empty()) {
        params.embeddings = cmd_params_defaults.embeddings;
    }
    if (params.n_threads.empty()) {
        params.n_threads = cmd_params_defaults.n_threads;
    }
    if (params.cpu_mask.empty()) {
        params.cpu_mask = cmd_params_defaults.cpu_mask;
    }
    if (params.cpu_strict.empty()) {
        params.cpu_strict = cmd_params_defaults.cpu_strict;
    }
    if (params.poll.empty()) {
        params.poll = cmd_params_defaults.poll;
    }

    return params;
}